

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

bool re2::ChildArgsChanged(Regexp *re,Regexp **child_args)

{
  ushort uVar1;
  ulong uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = re->nsub_;
  uVar5 = (ulong)uVar1;
  uVar4 = 0;
  while (uVar2 = uVar4, uVar5 != uVar2) {
    paVar3 = &re->field_5;
    if (1 < uVar1) {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    uVar4 = uVar2 + 1;
    if (child_args[uVar2] != (Regexp *)paVar3[uVar2].submany_) goto LAB_001e3781;
  }
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    Regexp::Decref(child_args[uVar4]);
    uVar1 = re->nsub_;
  }
LAB_001e3781:
  return uVar2 < uVar5;
}

Assistant:

static bool ChildArgsChanged(Regexp* re, Regexp** child_args) {
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* sub = re->sub()[i];
    Regexp* newsub = child_args[i];
    if (newsub != sub)
      return true;
  }
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* newsub = child_args[i];
    newsub->Decref();
  }
  return false;
}